

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmselect.c
# Opt level: O3

void libcmselect_LTX_select_shutdown(CMtrans_services svc,CManager_conflict cm,void *client_data)

{
  pthread_t *ppVar1;
  pthread_t pVar2;
  pthread_t pVar3;
  
  ppVar1 = *client_data;
  (*svc->verbose)((CManager)ppVar1[8],CMSelectVerbose,"CMSelect Shutdown task called");
  pVar2 = *ppVar1;
  pVar3 = pthread_self();
  if (pVar2 == pVar3) {
    return;
  }
  *(undefined4 *)(ppVar1 + 7) = 1;
  wake_server_thread((select_data_ptr)(ulong)(uint)ppVar1[10]);
  return;
}

Assistant:

extern void
libcmselect_LTX_select_shutdown(CMtrans_services svc, CManager cm, void *client_data)
{
    select_data_ptr *sdp = client_data;
    select_data_ptr sd = *sdp;

    svc->verbose(sd->cm, CMSelectVerbose, "CMSelect Shutdown task called");
    if (sd->server_thread != thr_thread_self()) {
	sd->closed = 1;
	wake_server_thread(sd);
    }
}